

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq4_nl(block_iq4_nl *x,float *y,int64_t k)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  int j;
  float d;
  uint8_t *qs;
  int i;
  int64_t nb;
  int local_38;
  int local_24;
  long local_10;
  
  local_10 = in_RSI;
  for (local_24 = 0; (long)local_24 < in_RDX / 0x20; local_24 = local_24 + 1) {
    lVar1 = in_RDI + (long)local_24 * 0x12 + 2;
    fVar2 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_24 * 0x12));
    for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
      *(float *)(local_10 + (long)local_38 * 4) =
           fVar2 * (float)(int)kvalues_iq4nl[(int)(*(byte *)(lVar1 + local_38) & 0xf)];
      *(float *)(local_10 + (long)(local_38 + 0x10) * 4) =
           fVar2 * (float)(int)kvalues_iq4nl[(int)(uint)*(byte *)(lVar1 + local_38) >> 4];
    }
    local_10 = local_10 + 0x80;
  }
  return;
}

Assistant:

void dequantize_row_iq4_nl(const block_iq4_nl * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK4_NL == 0);
    const int64_t nb = k / QK4_NL;

    for (int i = 0; i < nb; i++) {

        const uint8_t * qs = x[i].qs;

        const float d = GGML_FP16_TO_FP32(x[i].d);
        for (int j = 0; j < QK4_NL/2; ++j) {
            y[j+       0] = d * kvalues_iq4nl[qs[j] & 0xf];
            y[j+QK4_NL/2] = d * kvalues_iq4nl[qs[j] >>  4];
        }
        y  += QK4_NL;
        qs += QK4_NL/2;
    }
}